

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

word * Ifn_NtkDeriveTruth(Ifn_Ntk_t *p,int *pValues)

{
  word *__s;
  size_t __n;
  int iVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int *piVar11;
  int iVar12;
  word *pwVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  word *__s_00;
  
  iVar1 = p->nInps;
  lVar17 = (long)iVar1;
  if (0 < lVar17) {
    uVar2 = p->nParsVNum;
    pwVar13 = p->pTtObjs;
    uVar5 = p->nWords;
    lVar16 = 0;
    bVar4 = (char)iVar1 - 6;
    if (iVar1 < 7) {
      bVar4 = 0;
    }
    piVar11 = p->Values + p->nParsVIni;
    do {
      iVar12 = 0;
      if (0 < (int)uVar2) {
        uVar7 = 0;
        iVar12 = 0;
        do {
          iVar18 = 1 << ((byte)uVar7 & 0x1f);
          if (piVar11[uVar7] == 0) {
            iVar18 = 0;
          }
          iVar12 = iVar12 + iVar18;
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      if (0 < (int)uVar5) {
        uVar7 = 0;
        do {
          pwVar13[uVar7] = p->pTtElems[(long)(iVar12 << (bVar4 & 0x1f)) + uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      lVar16 = lVar16 + 1;
      piVar11 = piVar11 + (int)uVar2;
      pwVar13 = pwVar13 + (int)uVar5;
    } while (lVar16 != lVar17);
  }
  iVar12 = p->nObjs;
  if (iVar1 < iVar12) {
    uVar2 = p->nWords;
    lVar16 = (long)(int)uVar2;
    __s_00 = p->pTtObjs + (int)(uVar2 * iVar12);
    uVar7 = (ulong)uVar2;
    __n = uVar7 * 8;
    pwVar13 = p->pTtObjs + lVar17 * lVar16;
    do {
      uVar5 = *(uint *)(p->Nodes + lVar17) & 7;
      if (3 < uVar5 - 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x3c1,"word *Ifn_NtkDeriveTruth(Ifn_Ntk_t *, int *)");
      }
      uVar15 = *(uint *)(p->Nodes + lVar17) >> 3 & 0x1f;
      uVar14 = (ulong)uVar15;
      __s = p->pTtObjs + lVar17 * lVar16;
      switch(uVar5) {
      case 3:
        if (0 < (int)uVar2) {
          memset(__s,0xff,__n);
        }
        if (uVar15 != 0) {
          uVar6 = 0;
          do {
            if (0 < (int)uVar2) {
              iVar1 = p->Nodes[lVar17].Fanins[uVar6];
              uVar9 = 0;
              do {
                pwVar13[uVar9] = pwVar13[uVar9] & p->pTtObjs[(long)(int)(iVar1 * uVar2) + uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar7 != uVar9);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar14);
        }
        break;
      case 4:
        if (0 < (int)uVar2) {
          memset(__s,0,__n);
        }
        if (uVar15 != 0) {
          uVar6 = 0;
          do {
            if (0 < (int)uVar2) {
              iVar1 = p->Nodes[lVar17].Fanins[uVar6];
              uVar9 = 0;
              do {
                pwVar13[uVar9] = pwVar13[uVar9] ^ p->pTtObjs[(long)(int)(iVar1 * uVar2) + uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar7 != uVar9);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar14);
        }
        break;
      case 5:
        if (uVar15 != 3) {
          __assert_fail("nFans == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                        ,0x3ac,"word *Ifn_NtkDeriveTruth(Ifn_Ntk_t *, int *)");
        }
        if (0 < (int)uVar2) {
          iVar1 = p->Nodes[lVar17].Fanins[0];
          iVar18 = p->Nodes[lVar17].Fanins[1];
          iVar3 = p->Nodes[lVar17].Fanins[2];
          uVar14 = 0;
          do {
            pwVar13[uVar14] =
                 (p->pTtObjs[(long)(int)(iVar18 * uVar2) + uVar14] ^
                 p->pTtObjs[(long)(int)(iVar3 * uVar2) + uVar14]) &
                 p->pTtObjs[(long)(int)(iVar1 * uVar2) + uVar14] ^
                 p->pTtObjs[(long)(int)(iVar3 * uVar2) + uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar7 != uVar14);
        }
        break;
      case 6:
        uVar5 = 1 << (sbyte)uVar15;
        if (0 < (int)uVar2) {
          memset(__s,0,__n);
        }
        if (uVar15 != 0x1f) {
          if ((int)uVar5 < 2) {
            uVar5 = 1;
          }
          uVar10 = 0;
          do {
            if (pValues[(byte)p->Nodes[lVar17].field_0x1 + uVar10] != 0) {
              if (0 < (int)uVar2) {
                memset(__s_00,0xff,__n);
              }
              if (uVar15 != 0) {
                uVar6 = 0;
                do {
                  lVar8 = (long)(int)(p->Nodes[lVar17].Fanins[uVar6] * uVar2);
                  if ((uVar10 >> ((uint)uVar6 & 0x1f) & 1) == 0) {
                    if (0 < (int)uVar2) {
                      uVar9 = 0;
                      do {
                        __s_00[uVar9] = __s_00[uVar9] & ~p->pTtObjs[lVar8 + uVar9];
                        uVar9 = uVar9 + 1;
                      } while (uVar7 != uVar9);
                    }
                  }
                  else if (0 < (int)uVar2) {
                    uVar9 = 0;
                    do {
                      __s_00[uVar9] = __s_00[uVar9] & p->pTtObjs[lVar8 + uVar9];
                      uVar9 = uVar9 + 1;
                    } while (uVar7 != uVar9);
                  }
                  uVar6 = uVar6 + 1;
                } while (uVar6 != uVar14);
              }
              if (0 < (int)uVar2) {
                uVar6 = 0;
                do {
                  pwVar13[uVar6] = pwVar13[uVar6] | __s_00[uVar6];
                  uVar6 = uVar6 + 1;
                } while (uVar7 != uVar6);
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar5);
        }
      }
      lVar17 = lVar17 + 1;
      pwVar13 = pwVar13 + lVar16;
    } while (iVar12 != (int)lVar17);
  }
  return p->pTtObjs + (long)p->nWords * ((long)iVar12 + -1);
}

Assistant:

word * Ifn_NtkDeriveTruth( Ifn_Ntk_t * p, int * pValues )
{
    int i, v, f, iVar, iStart;
    // elementary variables
    for ( i = 0; i < p->nInps; i++ )
    {
        // find variable
        iStart = p->nParsVIni + i * p->nParsVNum;
        for ( v = iVar = 0; v < p->nParsVNum; v++ )
            if ( p->Values[iStart+v] )
                iVar += (1 << v);
        // assign variable
        Abc_TtCopy( Ifn_ObjTruth(p, i), Ifn_ElemTruth(p, iVar), p->nWords, 0 );
    }
    // internal variables
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        word * pTruth = Ifn_ObjTruth( p, i );
        if ( p->Nodes[i].Type == IFN_DSD_AND )
        {
            Abc_TtFill( pTruth, p->nWords );
            for ( f = 0; f < nFans; f++ )
                Abc_TtAnd( pTruth, pTruth, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_XOR )
        {
            Abc_TtClear( pTruth, p->nWords );
            for ( f = 0; f < nFans; f++ )
                Abc_TtXor( pTruth, pTruth, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_MUX )
        {
            assert( nFans == 3 );
            Abc_TtMux( pTruth, Ifn_ObjTruth(p, pFans[0]), Ifn_ObjTruth(p, pFans[1]), Ifn_ObjTruth(p, pFans[2]), p->nWords );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_PRIME )
        {
            int nValues = (1 << nFans);
            word * pTemp = Ifn_ObjTruth(p, p->nObjs);
            Abc_TtClear( pTruth, p->nWords );
            for ( v = 0; v < nValues; v++ )
            {
                if ( pValues[p->Nodes[i].iFirst + v] == 0 )
                    continue;
                Abc_TtFill( pTemp, p->nWords );
                for ( f = 0; f < nFans; f++ )
                    if ( (v >> f) & 1 )
                        Abc_TtAnd( pTemp, pTemp, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
                    else
                        Abc_TtSharp( pTemp, pTemp, Ifn_ObjTruth(p, pFans[f]), p->nWords );
                Abc_TtOr( pTruth, pTruth, pTemp, p->nWords );
            }
        }
        else assert( 0 );
//Dau_DsdPrintFromTruth( pTruth, p->nVars );
    }
    return Ifn_ObjTruth(p, p->nObjs-1);
}